

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> *
getAscendingNumbers(vector<int,_std::allocator<int>_> *__return_storage_ptr__,int inputSize)

{
  value_type_conflict1 local_1c;
  undefined1 local_15;
  int i;
  vector<int,_std::allocator<int>_> *pvStack_10;
  int inputSize_local;
  vector<int,_std::allocator<int>_> *ascendingNumbers;
  
  local_15 = 0;
  i = inputSize;
  pvStack_10 = __return_storage_ptr__;
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__);
  for (local_1c = 0; local_1c < i; local_1c = local_1c + 1) {
    std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&local_1c);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<int> getAscendingNumbers(int inputSize) {
    vector<int> ascendingNumbers;

    for (int i = 0; i < inputSize; i++) {
        ascendingNumbers.push_back(i);
    }
    return ascendingNumbers;
}